

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::ParseHierarchyChunk(Discreet3DSImporter *this,uint16_t parent)

{
  StreamReader<false,_false> *this_00;
  aiVector3t<float> axis_00;
  undefined1 auVar1 [8];
  double dVar2;
  int8_t *__s;
  undefined8 uVar3;
  int8_t iVar4;
  bool bVar5;
  bool bVar6;
  int16_t iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  float fVar12;
  Node *this_01;
  Logger *pLVar13;
  reference pvVar14;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *this_02;
  reference pvVar15;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *this_03;
  reference pvVar16;
  vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_> *this_04;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
  local_2c8;
  const_iterator local_2c0;
  aiVectorKey *local_2b8;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
  local_2b0;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
  local_2a8;
  const_iterator local_2a0;
  aiVectorKey *local_298;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
  local_290;
  undefined1 local_288 [8];
  aiVectorKey v_3;
  uint fidx_3;
  uint i_3;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *l_3;
  bool sortKeys_3;
  uint numFrames_3;
  __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_> local_250;
  const_iterator local_248;
  aiQuatKey *local_240;
  __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_> local_238;
  __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_> local_230;
  const_iterator local_228;
  aiQuatKey *local_220;
  __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_> local_218;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  float local_1f8;
  aiQuaterniont<float> local_1f0;
  undefined1 local_1e0 [8];
  aiVector3D axis;
  float rad;
  aiQuatKey v_2;
  uint fidx_2;
  uint i_2;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *l_2;
  bool sortKeys_2;
  uint numFrames_2;
  __normal_iterator<Assimp::D3DS::aiFloatKey_*,_std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>_>
  local_198;
  const_iterator local_190;
  aiFloatKey *local_188;
  __normal_iterator<Assimp::D3DS::aiFloatKey_*,_std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>_>
  local_180;
  __normal_iterator<Assimp::D3DS::aiFloatKey_*,_std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>_>
  local_178;
  const_iterator local_170;
  aiFloatKey *local_168;
  __normal_iterator<Assimp::D3DS::aiFloatKey_*,_std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>_>
  local_160;
  undefined1 local_158 [8];
  aiFloatKey v_1;
  uint local_140;
  uint fidx_1;
  uint i_1;
  uint numFrames_1;
  vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_> *l_1;
  bool sortKeys_1;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
  local_120;
  const_iterator local_118;
  aiVectorKey *local_110;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
  local_108;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
  local_100;
  const_iterator local_f8;
  aiVectorKey *local_f0;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_> local_e8
  ;
  undefined1 local_e0 [8];
  aiVectorKey v;
  uint fidx;
  uint i;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *l;
  bool sortKeys;
  uint numFrames;
  int8_t *local_88;
  char *sz_1;
  undefined4 local_78;
  int32_t iStack_74;
  uint16_t hierarchy;
  Node *pNStack_70;
  int instanceNumber;
  Node *pcNode;
  allocator local_51;
  undefined1 local_50 [8];
  string name;
  char *sz;
  uint cnt;
  uint oldReadLimit;
  int chunkSize;
  Chunk chunk;
  uint16_t parent_local;
  Discreet3DSImporter *this_local;
  
  chunkSize._2_2_ = parent;
  _chunk = this;
  do {
    do {
      uVar8 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar8 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)&oldReadLimit);
      iVar9 = stack0xffffffffffffffea - 6;
    } while (iVar9 < 1);
    this_00 = this->stream;
    iVar10 = StreamReader<false,_false>::GetCurrentPos(this_00);
    uVar8 = StreamReader<false,_false>::SetReadLimit(this_00,iVar10 + iVar9);
    switch((undefined2)oldReadLimit) {
    case 0xb010:
      sz._4_4_ = 0;
      name.field_2._8_8_ = StreamReader<false,_false>::GetPtr(this->stream);
      while (iVar4 = StreamReader<false,_false>::GetI1(this->stream), uVar3 = name.field_2._8_8_,
            iVar4 != '\0') {
        sz._4_4_ = sz._4_4_ + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_50,(char *)uVar3,(ulong)sz._4_4_,&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      pNStack_70 = FindNode(this->mRootNode,(string *)local_50);
      iStack_74 = 1;
      if (pNStack_70 == (Node *)0x0) {
LAB_005fa3c4:
        this_01 = (Node *)operator_new(0xf8);
        D3DS::Node::Node(this_01,(string *)local_50);
        this_01->mInstanceNumber = iStack_74;
        pNStack_70 = this_01;
        StreamReader<false,_false>::IncPtr(this->stream,4);
        iVar7 = StreamReader<false,_false>::GetI2(this->stream);
        sz_1._6_2_ = iVar7 + 1;
        pNStack_70->mHierarchyPos = sz_1._6_2_;
        pNStack_70->mHierarchyIndex = this->mLastNodeIndex;
        if ((this->mCurrentNode == (Node *)0x0) ||
           ((int)this->mCurrentNode->mHierarchyPos != (uint)sz_1._6_2_)) {
          if ((int)(uint)sz_1._6_2_ < (int)this->mLastNodeIndex) {
            InverseNodeSearch(this,pNStack_70,this->mCurrentNode);
            this->mLastNodeIndex = this->mLastNodeIndex + 1;
          }
          else {
            D3DS::Node::push_back(this->mCurrentNode,pNStack_70);
            this->mLastNodeIndex = sz_1._6_2_;
          }
        }
        else {
          D3DS::Node::push_back(this->mCurrentNode->mParent,pNStack_70);
          this->mLastNodeIndex = this->mLastNodeIndex + 1;
        }
        this->mCurrentNode = pNStack_70;
        local_78 = 0;
      }
      else {
        if (chunkSize._2_2_ == 0xb002) {
          pNStack_70->mInstanceCount = pNStack_70->mInstanceCount + 1;
          iStack_74 = pNStack_70->mInstanceCount;
          goto LAB_005fa3c4;
        }
        this->mCurrentNode = pNStack_70;
        local_78 = 4;
      }
      std::__cxx11::string::~string((string *)local_50);
      break;
    case 0xb011:
      local_88 = StreamReader<false,_false>::GetPtr(this->stream);
      do {
        iVar4 = StreamReader<false,_false>::GetI1(this->stream);
      } while (iVar4 != '\0');
      bVar5 = std::operator==(&this->mCurrentNode->mName,"$$$DUMMY");
      __s = local_88;
      if (bVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&numFrames,__s,(allocator<char> *)&sortKeys);
        std::__cxx11::string::operator=((string *)&this->mCurrentNode->mName,(string *)&numFrames);
        std::__cxx11::string::~string((string *)&numFrames);
        std::allocator<char>::~allocator((allocator<char> *)&sortKeys);
      }
      break;
    case 0xb013:
      if (chunkSize._2_2_ == 0xb002) {
        fVar12 = StreamReader<false,_false>::GetF4(this->stream);
        (this->mCurrentNode->vPivot).x = fVar12;
        fVar12 = StreamReader<false,_false>::GetF4(this->stream);
        (this->mCurrentNode->vPivot).y = fVar12;
        fVar12 = StreamReader<false,_false>::GetF4(this->stream);
        (this->mCurrentNode->vPivot).z = fVar12;
      }
      else {
        pLVar13 = DefaultLogger::get();
        Logger::warn(pLVar13,"3DS: Skipping pivot subchunk for non usual object");
      }
      break;
    case 0xb020:
      StreamReader<false,_false>::IncPtr(this->stream,10);
      uVar11 = StreamReader<false,_false>::GetI4(this->stream);
      bVar5 = false;
      if ((chunkSize._2_2_ == 0xb004) || (chunkSize._2_2_ == 0xb006)) {
        _fidx = &this->mCurrentNode->aTargetPositionKeys;
      }
      else {
        _fidx = &this->mCurrentNode->aPositionKeys;
      }
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(_fidx,(ulong)uVar11);
      for (v._20_4_ = 0; (uint)v._20_4_ < uVar11; v._20_4_ = v._20_4_ + 1) {
        v.mValue.z = (float)StreamReader<false,_false>::GetI4(this->stream);
        aiVectorKey::aiVectorKey((aiVectorKey *)local_e0);
        local_e0 = (undefined1  [8])(double)(uint)v.mValue.z;
        SkipTCBInfo(this);
        v.mTime._0_4_ = StreamReader<false,_false>::GetF4(this->stream);
        v.mTime._4_4_ = StreamReader<false,_false>::GetF4(this->stream);
        v.mValue.x = StreamReader<false,_false>::GetF4(this->stream);
        bVar6 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::empty(_fidx);
        auVar1 = local_e0;
        if ((!bVar6) &&
           (pvVar16 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::back(_fidx),
           (double)auVar1 <= pvVar16->mTime)) {
          bVar5 = true;
        }
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                  (_fidx,(value_type *)local_e0);
      }
      if (bVar5) {
        local_e8._M_current =
             (aiVectorKey *)std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::begin(_fidx);
        local_f0 = (aiVectorKey *)std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::end(_fidx)
        ;
        std::
        stable_sort<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>>
                  (local_e8,(__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
                             )local_f0);
        local_108._M_current =
             (aiVectorKey *)std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::begin(_fidx);
        local_110 = (aiVectorKey *)
                    std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::end(_fidx);
        local_100 = std::
                    unique<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,bool(*)(aiVectorKey_const&,aiVectorKey_const&)>
                              (local_108,
                               (__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
                                )local_110,KeyUniqueCompare<aiVectorKey>);
        __gnu_cxx::
        __normal_iterator<aiVectorKey_const*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>::
        __normal_iterator<aiVectorKey*>
                  ((__normal_iterator<aiVectorKey_const*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>
                    *)&local_f8,&local_100);
        local_120._M_current =
             (aiVectorKey *)std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::end(_fidx);
        __gnu_cxx::
        __normal_iterator<aiVectorKey_const*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>::
        __normal_iterator<aiVectorKey*>
                  ((__normal_iterator<aiVectorKey_const*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>
                    *)&local_118,&local_120);
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::erase(_fidx,local_f8,local_118);
      }
      break;
    case 0xb021:
      StreamReader<false,_false>::IncPtr(this->stream,10);
      fVar12 = (float)StreamReader<false,_false>::GetI4(this->stream);
      bVar5 = false;
      this_02 = &this->mCurrentNode->aRotationKeys;
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::reserve(this_02,(ulong)(uint)fVar12);
      for (v_2.mValue.z = 0.0; (uint)v_2.mValue.z < (uint)fVar12;
          v_2.mValue.z = (float)((int)v_2.mValue.z + 1)) {
        uVar11 = StreamReader<false,_false>::GetI4(this->stream);
        SkipTCBInfo(this);
        aiQuatKey::aiQuatKey((aiQuatKey *)&axis.z);
        register0x00001200 = (double)uVar11;
        axis.y = StreamReader<false,_false>::GetF4(this->stream);
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_1e0);
        local_1e0._0_4_ = StreamReader<false,_false>::GetF4(this->stream);
        local_1e0._4_4_ = StreamReader<false,_false>::GetF4(this->stream);
        local_208 = StreamReader<false,_false>::GetF4(this->stream);
        if ((((((float)local_1e0._0_4_ == 0.0) && (!NAN((float)local_1e0._0_4_))) &&
             ((float)local_1e0._4_4_ == 0.0)) &&
            ((!NAN((float)local_1e0._4_4_) && (local_208 == 0.0)))) && (!NAN(local_208))) {
          local_1e0._4_4_ = 1.0;
        }
        local_210 = CONCAT44(local_1e0._4_4_,local_1e0._0_4_);
        axis_00.z = local_208;
        axis_00.x = (float)local_1e0._0_4_;
        axis_00.y = (float)local_1e0._4_4_;
        local_200 = local_210;
        local_1f8 = local_208;
        axis.x = local_208;
        aiQuaterniont<float>::aiQuaterniont(&local_1f0,axis_00,axis.y);
        bVar6 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::empty(this_02);
        dVar2 = stack0xfffffffffffffe30;
        if ((!bVar6) &&
           (pvVar15 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::back(this_02),
           dVar2 <= pvVar15->mTime)) {
          bVar5 = true;
        }
        std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::push_back(this_02,(value_type *)&axis.z)
        ;
      }
      if (bVar5) {
        local_218._M_current =
             (aiQuatKey *)std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::begin(this_02);
        local_220 = (aiQuatKey *)std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::end(this_02);
        std::
        stable_sort<__gnu_cxx::__normal_iterator<aiQuatKey*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>>
                  (local_218,
                   (__normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_>
                    )local_220);
        local_238._M_current =
             (aiQuatKey *)std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::begin(this_02);
        local_240 = (aiQuatKey *)std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::end(this_02);
        local_230 = std::
                    unique<__gnu_cxx::__normal_iterator<aiQuatKey*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>,bool(*)(aiQuatKey_const&,aiQuatKey_const&)>
                              (local_238,
                               (__normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_>
                                )local_240,KeyUniqueCompare<aiQuatKey>);
        __gnu_cxx::
        __normal_iterator<aiQuatKey_const*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>::
        __normal_iterator<aiQuatKey*>
                  ((__normal_iterator<aiQuatKey_const*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>
                    *)&local_228,&local_230);
        local_250._M_current =
             (aiQuatKey *)std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::end(this_02);
        __gnu_cxx::
        __normal_iterator<aiQuatKey_const*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>::
        __normal_iterator<aiQuatKey*>
                  ((__normal_iterator<aiQuatKey_const*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>
                    *)&local_248,&local_250);
        std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::erase(this_02,local_228,local_248);
      }
      break;
    case 0xb022:
      StreamReader<false,_false>::IncPtr(this->stream,10);
      iVar7 = StreamReader<false,_false>::GetI2(this->stream);
      StreamReader<false,_false>::IncPtr(this->stream,2);
      bVar5 = false;
      this_03 = &this->mCurrentNode->aScalingKeys;
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve
                (this_03,(ulong)(uint)(int)iVar7);
      for (v_3._20_4_ = 0; (uint)v_3._20_4_ < (uint)(int)iVar7; v_3._20_4_ = v_3._20_4_ + 1) {
        v_3.mValue.z = (float)StreamReader<false,_false>::GetI4(this->stream);
        SkipTCBInfo(this);
        aiVectorKey::aiVectorKey((aiVectorKey *)local_288);
        local_288 = (undefined1  [8])(double)(uint)v_3.mValue.z;
        v_3.mTime._0_4_ = StreamReader<false,_false>::GetF4(this->stream);
        v_3.mTime._4_4_ = StreamReader<false,_false>::GetF4(this->stream);
        v_3.mValue.x = StreamReader<false,_false>::GetF4(this->stream);
        bVar6 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::empty(this_03);
        auVar1 = local_288;
        if ((!bVar6) &&
           (pvVar16 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::back(this_03),
           (double)auVar1 <= pvVar16->mTime)) {
          bVar5 = true;
        }
        if ((v_3.mTime._0_4_ == 0.0) && (!NAN(v_3.mTime._0_4_))) {
          v_3.mTime._0_4_ = 1.0;
        }
        if ((v_3.mTime._4_4_ == 0.0) && (!NAN(v_3.mTime._4_4_))) {
          v_3.mTime._4_4_ = 1.0;
        }
        if ((v_3.mValue.x == 0.0) && (!NAN(v_3.mValue.x))) {
          v_3.mValue.x = 1.0;
        }
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                  (this_03,(value_type *)local_288);
      }
      if (bVar5) {
        local_290._M_current =
             (aiVectorKey *)std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::begin(this_03);
        local_298 = (aiVectorKey *)
                    std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::end(this_03);
        std::
        stable_sort<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>>
                  (local_290,
                   (__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
                    )local_298);
        local_2b0._M_current =
             (aiVectorKey *)std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::begin(this_03);
        local_2b8 = (aiVectorKey *)
                    std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::end(this_03);
        local_2a8 = std::
                    unique<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,bool(*)(aiVectorKey_const&,aiVectorKey_const&)>
                              (local_2b0,
                               (__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
                                )local_2b8,KeyUniqueCompare<aiVectorKey>);
        __gnu_cxx::
        __normal_iterator<aiVectorKey_const*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>::
        __normal_iterator<aiVectorKey*>
                  ((__normal_iterator<aiVectorKey_const*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>
                    *)&local_2a0,&local_2a8);
        local_2c8._M_current =
             (aiVectorKey *)std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::end(this_03);
        __gnu_cxx::
        __normal_iterator<aiVectorKey_const*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>::
        __normal_iterator<aiVectorKey*>
                  ((__normal_iterator<aiVectorKey_const*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>
                    *)&local_2c0,&local_2c8);
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::erase(this_03,local_2a0,local_2c0);
      }
      break;
    case 0xb023:
      pLVar13 = DefaultLogger::get();
      Logger::error(pLVar13,"3DS: Skipping FOV animation track. This is not supported");
      break;
    case 0xb024:
      if (chunkSize._2_2_ == 0xb003) {
        bVar5 = false;
        this_04 = &this->mCurrentNode->aCameraRollKeys;
        StreamReader<false,_false>::IncPtr(this->stream,10);
        uVar11 = StreamReader<false,_false>::GetI4(this->stream);
        std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::reserve
                  (this_04,(ulong)uVar11);
        for (local_140 = 0; local_140 < uVar11; local_140 = local_140 + 1) {
          v_1._12_4_ = StreamReader<false,_false>::GetI4(this->stream);
          local_158 = (undefined1  [8])(double)(uint)v_1._12_4_;
          SkipTCBInfo(this);
          v_1.mTime._0_4_ = StreamReader<false,_false>::GetF4(this->stream);
          bVar6 = std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
                  empty(this_04);
          auVar1 = local_158;
          if ((!bVar6) &&
             (pvVar14 = std::
                        vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                        ::back(this_04), (double)auVar1 <= pvVar14->mTime)) {
            bVar5 = true;
          }
          std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
          push_back(this_04,(value_type *)local_158);
        }
        if (bVar5) {
          local_160._M_current =
               (aiFloatKey *)
               std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
               begin(this_04);
          local_168 = (aiFloatKey *)
                      std::
                      vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
                      end(this_04);
          std::
          stable_sort<__gnu_cxx::__normal_iterator<Assimp::D3DS::aiFloatKey*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>>
                    (local_160,
                     (__normal_iterator<Assimp::D3DS::aiFloatKey_*,_std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>_>
                      )local_168);
          local_180._M_current =
               (aiFloatKey *)
               std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
               begin(this_04);
          local_188 = (aiFloatKey *)
                      std::
                      vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
                      end(this_04);
          local_178 = std::
                      unique<__gnu_cxx::__normal_iterator<Assimp::D3DS::aiFloatKey*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>,bool(*)(Assimp::D3DS::aiFloatKey_const&,Assimp::D3DS::aiFloatKey_const&)>
                                (local_180,
                                 (__normal_iterator<Assimp::D3DS::aiFloatKey_*,_std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>_>
                                  )local_188,KeyUniqueCompare<Assimp::D3DS::aiFloatKey>);
          __gnu_cxx::
          __normal_iterator<Assimp::D3DS::aiFloatKey_const*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>
          ::__normal_iterator<Assimp::D3DS::aiFloatKey*>
                    ((__normal_iterator<Assimp::D3DS::aiFloatKey_const*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>
                      *)&local_170,&local_178);
          local_198._M_current =
               (aiFloatKey *)
               std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::end
                         (this_04);
          __gnu_cxx::
          __normal_iterator<Assimp::D3DS::aiFloatKey_const*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>
          ::__normal_iterator<Assimp::D3DS::aiFloatKey*>
                    ((__normal_iterator<Assimp::D3DS::aiFloatKey_const*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>
                      *)&local_190,&local_198);
          std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::erase
                    (this_04,local_170,local_190);
        }
      }
      else {
        pLVar13 = DefaultLogger::get();
        Logger::warn(pLVar13,"3DS: Ignoring roll track for non-camera object");
      }
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,uVar8);
    uVar8 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
    if (uVar8 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseHierarchyChunk(uint16_t parent)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_TRACKOBJNAME:

        // This is the name of the object to which the track applies. The chunk also
        // defines the position of this object in the hierarchy.
        {

        // First of all: get the name of the object
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();

        while (stream->GetI1())++cnt;
        std::string name = std::string(sz,cnt);

        // Now find out whether we have this node already (target animation channels
        // are stored with a separate object ID)
        D3DS::Node* pcNode = FindNode(mRootNode,name);
        int instanceNumber = 1;

        if ( pcNode)
        {
            // if the source is not a CHUNK_TRACKINFO block it won't be an object instance
            if (parent != Discreet3DS::CHUNK_TRACKINFO)
            {
                mCurrentNode = pcNode;
                break;
            }
            pcNode->mInstanceCount++;
            instanceNumber = pcNode->mInstanceCount;
        }
        pcNode = new D3DS::Node(name);
        pcNode->mInstanceNumber = instanceNumber;

        // There are two unknown values which we can safely ignore
        stream->IncPtr(4);

        // Now read the hierarchy position of the object
        uint16_t hierarchy = stream->GetI2() + 1;
        pcNode->mHierarchyPos   = hierarchy;
        pcNode->mHierarchyIndex = mLastNodeIndex;

        // And find a proper position in the graph for it
        if (mCurrentNode && mCurrentNode->mHierarchyPos == hierarchy)   {

            // add to the parent of the last touched node
            mCurrentNode->mParent->push_back(pcNode);
            mLastNodeIndex++;
        }
        else if(hierarchy >= mLastNodeIndex)    {

            // place it at the current position in the hierarchy
            mCurrentNode->push_back(pcNode);
            mLastNodeIndex = hierarchy;
        }
        else    {
            // need to go back to the specified position in the hierarchy.
            InverseNodeSearch(pcNode,mCurrentNode);
            mLastNodeIndex++;
        }
        // Make this node the current node
        mCurrentNode = pcNode;
        }
        break;

    case Discreet3DS::CHUNK_TRACKDUMMYOBJNAME:

        // This is the "real" name of a $$$DUMMY object
        {
            const char* sz = (const char*) stream->GetPtr();
            while (stream->GetI1());

            // If object name is DUMMY, take this one instead
            if (mCurrentNode->mName == "$$$DUMMY")  {
                mCurrentNode->mName = std::string(sz);
                break;
            }
        }
        break;

    case Discreet3DS::CHUNK_TRACKPIVOT:

        if ( Discreet3DS::CHUNK_TRACKINFO != parent)
        {
            ASSIMP_LOG_WARN("3DS: Skipping pivot subchunk for non usual object");
            break;
        }

        // Pivot = origin of rotation and scaling
        mCurrentNode->vPivot.x = stream->GetF4();
        mCurrentNode->vPivot.y = stream->GetF4();
        mCurrentNode->vPivot.z = stream->GetF4();
        break;


        // ////////////////////////////////////////////////////////////////////
        // POSITION KEYFRAME
    case Discreet3DS::CHUNK_TRACKPOS:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();
        bool sortKeys = false;

        // This could also be meant as the target position for
        // (targeted) lights and cameras
        std::vector<aiVectorKey>* l;
        if ( Discreet3DS::CHUNK_TRACKCAMTGT == parent || Discreet3DS::CHUNK_TRACKLIGTGT == parent)  {
            l = & mCurrentNode->aTargetPositionKeys;
        }
        else l = & mCurrentNode->aPositionKeys;

        l->reserve(numFrames);
        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();

            // Setup a new position key
            aiVectorKey v;
            v.mTime = (double)fidx;

            SkipTCBInfo();
            v.mValue.x = stream->GetF4();
            v.mValue.y = stream->GetF4();
            v.mValue.z = stream->GetF4();

            // check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Add the new keyframe to the list
            l->push_back(v);
        }

        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiVectorKey>), l->end() );
        }}

        break;

        // ////////////////////////////////////////////////////////////////////
        // CAMERA ROLL KEYFRAME
    case Discreet3DS::CHUNK_TRACKROLL:
        {
        // roll keys are accepted for cameras only
        if (parent != Discreet3DS::CHUNK_TRACKCAMERA)   {
            ASSIMP_LOG_WARN("3DS: Ignoring roll track for non-camera object");
            break;
        }
        bool sortKeys = false;
        std::vector<aiFloatKey>* l = &mCurrentNode->aCameraRollKeys;

        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();
        l->reserve(numFrames);
        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();

            // Setup a new position key
            aiFloatKey v;
            v.mTime = (double)fidx;

            // This is just a single float
            SkipTCBInfo();
            v.mValue = stream->GetF4();

            // Check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Add the new keyframe to the list
            l->push_back(v);
        }

        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiFloatKey>), l->end() );
        }}
        break;


        // ////////////////////////////////////////////////////////////////////
        // CAMERA FOV KEYFRAME
    case Discreet3DS::CHUNK_TRACKFOV:
        {
            ASSIMP_LOG_ERROR("3DS: Skipping FOV animation track. "
                "This is not supported");
        }
        break;


        // ////////////////////////////////////////////////////////////////////
        // ROTATION KEYFRAME
    case Discreet3DS::CHUNK_TRACKROTATE:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();

        bool sortKeys = false;
        std::vector<aiQuatKey>* l = &mCurrentNode->aRotationKeys;
        l->reserve(numFrames);

        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();
            SkipTCBInfo();

            aiQuatKey v;
            v.mTime = (double)fidx;

            // The rotation keyframe is given as an axis-angle pair
            const float rad = stream->GetF4();
            aiVector3D axis;
            axis.x = stream->GetF4();
            axis.y = stream->GetF4();
            axis.z = stream->GetF4();

            if (!axis.x && !axis.y && !axis.z)
                axis.y = 1.f;

            // Construct a rotation quaternion from the axis-angle pair
            v.mValue = aiQuaternion(axis,rad);

            // Check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // add the new keyframe to the list
            l->push_back(v);
        }
        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiQuatKey>), l->end() );
        }}
        break;

        // ////////////////////////////////////////////////////////////////////
        // SCALING KEYFRAME
    case Discreet3DS::CHUNK_TRACKSCALE:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI2();
        stream->IncPtr(2);

        bool sortKeys = false;
        std::vector<aiVectorKey>* l = &mCurrentNode->aScalingKeys;
        l->reserve(numFrames);

        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();
            SkipTCBInfo();

            // Setup a new key
            aiVectorKey v;
            v.mTime = (double)fidx;

            // ... and read its value
            v.mValue.x = stream->GetF4();
            v.mValue.y = stream->GetF4();
            v.mValue.z = stream->GetF4();

            // check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Remove zero-scalings on singular axes - they've been reported to be there erroneously in some strange files
            if (!v.mValue.x) v.mValue.x = 1.f;
            if (!v.mValue.y) v.mValue.y = 1.f;
            if (!v.mValue.z) v.mValue.z = 1.f;

            l->push_back(v);
        }
        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiVectorKey>), l->end() );
        }}
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}